

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::UpdateTextureID(ImDrawList *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ImVec4 *pIVar8;
  ImDrawCmd *__dest;
  long lVar9;
  void *pvVar10;
  int iVar11;
  ImDrawCmd *pIVar12;
  int iVar13;
  undefined1 auVar14 [16];
  
  lVar9 = (long)(this->_TextureIdStack).Size;
  if (lVar9 == 0) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = (this->_TextureIdStack).Data[lVar9 + -1];
  }
  uVar7 = (this->CmdBuffer).Size;
  if ((ulong)uVar7 == 0) {
    pIVar12 = (ImDrawCmd *)0x0;
  }
  else {
    if ((int)uVar7 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                    ,0x538,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar12 = (this->CmdBuffer).Data + ((ulong)uVar7 - 1);
  }
  if ((pIVar12 != (ImDrawCmd *)0x0) &&
     (((pIVar12->ElemCount == 0 || (pIVar12->TextureId == pvVar10)) &&
      (pIVar12->UserCallback == (ImDrawCallback)0x0)))) {
    if (((1 < (int)uVar7) && (pIVar12->ElemCount == 0)) && (pIVar12[-1].TextureId == pvVar10)) {
      lVar9 = (long)(this->_ClipRectStack).Size;
      pIVar8 = (this->_ClipRectStack).Data + lVar9 + -1;
      if (lVar9 == 0) {
        pIVar8 = &this->_Data->ClipRectFullscreen;
      }
      auVar14[0] = -(*(char *)&pIVar8->x == *(char *)&pIVar12[-1].ClipRect.x);
      auVar14[1] = -(*(char *)((long)&pIVar8->x + 1) == *(char *)((long)&pIVar12[-1].ClipRect.x + 1)
                    );
      auVar14[2] = -(*(char *)((long)&pIVar8->x + 2) == *(char *)((long)&pIVar12[-1].ClipRect.x + 2)
                    );
      auVar14[3] = -(*(char *)((long)&pIVar8->x + 3) == *(char *)((long)&pIVar12[-1].ClipRect.x + 3)
                    );
      auVar14[4] = -(*(char *)&pIVar8->y == *(char *)&pIVar12[-1].ClipRect.y);
      auVar14[5] = -(*(char *)((long)&pIVar8->y + 1) == *(char *)((long)&pIVar12[-1].ClipRect.y + 1)
                    );
      auVar14[6] = -(*(char *)((long)&pIVar8->y + 2) == *(char *)((long)&pIVar12[-1].ClipRect.y + 2)
                    );
      auVar14[7] = -(*(char *)((long)&pIVar8->y + 3) == *(char *)((long)&pIVar12[-1].ClipRect.y + 3)
                    );
      auVar14[8] = -(*(char *)&pIVar8->z == *(char *)&pIVar12[-1].ClipRect.z);
      auVar14[9] = -(*(char *)((long)&pIVar8->z + 1) == *(char *)((long)&pIVar12[-1].ClipRect.z + 1)
                    );
      auVar14[10] = -(*(char *)((long)&pIVar8->z + 2) ==
                     *(char *)((long)&pIVar12[-1].ClipRect.z + 2));
      auVar14[0xb] = -(*(char *)((long)&pIVar8->z + 3) ==
                      *(char *)((long)&pIVar12[-1].ClipRect.z + 3));
      auVar14[0xc] = -(*(char *)&pIVar8->w == *(char *)&pIVar12[-1].ClipRect.w);
      auVar14[0xd] = -(*(char *)((long)&pIVar8->w + 1) ==
                      *(char *)((long)&pIVar12[-1].ClipRect.w + 1));
      auVar14[0xe] = -(*(char *)((long)&pIVar8->w + 2) ==
                      *(char *)((long)&pIVar12[-1].ClipRect.w + 2));
      auVar14[0xf] = -(*(char *)((long)&pIVar8->w + 3) ==
                      *(char *)((long)&pIVar12[-1].ClipRect.w + 3));
      if (((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar14[0xf] >> 7) << 0xf) == 0xffff) &&
         (pIVar12[-1].UserCallback == (ImDrawCallback)0x0)) {
        (this->CmdBuffer).Size = uVar7 - 1;
        return;
      }
    }
    pIVar12->TextureId = pvVar10;
    return;
  }
  lVar9 = (long)(this->_ClipRectStack).Size;
  pIVar8 = (this->_ClipRectStack).Data + lVar9 + -1;
  if (lVar9 == 0) {
    pIVar8 = &this->_Data->ClipRectFullscreen;
  }
  fVar1 = pIVar8->x;
  fVar2 = pIVar8->z;
  lVar9 = (long)(this->_TextureIdStack).Size;
  if (lVar9 == 0) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = (this->_TextureIdStack).Data[lVar9 + -1];
  }
  if (fVar1 <= fVar2) {
    fVar3 = pIVar8->y;
    fVar4 = pIVar8->w;
    if (fVar3 <= fVar4) {
      uVar7 = (this->IdxBuffer).Size;
      uVar5 = this->_VtxCurrentOffset;
      iVar13 = (this->CmdBuffer).Size;
      iVar6 = (this->CmdBuffer).Capacity;
      if (iVar13 == iVar6) {
        iVar13 = iVar13 + 1;
        if (iVar6 == 0) {
          iVar11 = 8;
        }
        else {
          iVar11 = iVar6 / 2 + iVar6;
        }
        if (iVar13 < iVar11) {
          iVar13 = iVar11;
        }
        if (iVar6 < iVar13) {
          __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar13 * 0x38);
          pIVar12 = (this->CmdBuffer).Data;
          if (pIVar12 != (ImDrawCmd *)0x0) {
            memcpy(__dest,pIVar12,(long)(this->CmdBuffer).Size * 0x38);
            ImGui::MemFree((this->CmdBuffer).Data);
          }
          (this->CmdBuffer).Data = __dest;
          (this->CmdBuffer).Capacity = iVar13;
        }
      }
      pIVar12 = (this->CmdBuffer).Data;
      iVar13 = (this->CmdBuffer).Size;
      pIVar12[iVar13].ElemCount = 0;
      pIVar12[iVar13].ClipRect.x = fVar1;
      pIVar12[iVar13].ClipRect.y = fVar3;
      pIVar12[iVar13].ClipRect.z = fVar2;
      pIVar12[iVar13].ClipRect.w = fVar4;
      pIVar12[iVar13].TextureId = pvVar10;
      pIVar12[iVar13].VtxOffset = uVar5;
      pIVar12[iVar13].IdxOffset = uVar7;
      pIVar12[iVar13].UserCallback = (ImDrawCallback)0x0;
      (&pIVar12[iVar13].UserCallback)[1] = (ImDrawCallback)0x0;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
      return;
    }
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                ,0x1af,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::UpdateTextureID()
{
    // If current command is used with different settings we need to add a new command
    const ImTextureID curr_texture_id = GetCurrentTextureId();
    ImDrawCmd* curr_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != curr_texture_id) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && prev_cmd->TextureId == curr_texture_id && memcmp(&prev_cmd->ClipRect, &GetCurrentClipRect(), sizeof(ImVec4)) == 0 && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->TextureId = curr_texture_id;
}